

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  stbtt_uint32 sVar1;
  stbtt__buf *in_RDI;
  stbtt__buf sVar2;
  int offsize;
  int start;
  int count;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  stbtt__buf *in_stack_ffffffffffffffd0;
  
  sVar1 = stbtt__buf_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (sVar1 != 0) {
    stbtt__buf_get8(in_RDI);
    stbtt__buf_skip(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    stbtt__buf_get(in_RDI,in_stack_ffffffffffffffcc);
    stbtt__buf_skip(in_RDI,in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = in_RDI;
  }
  sVar2 = stbtt__buf_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           in_stack_ffffffffffffffc8);
  return sVar2;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
int count, start, offsize;
start = b->cursor;
count = stbtt__buf_get16(b);
if (count) {
offsize = stbtt__buf_get8(b);
STBTT_assert(offsize >= 1 && offsize <= 4);
stbtt__buf_skip(b, offsize * count);
stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
}
return stbtt__buf_range(b, start, b->cursor - start);
}